

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ForeachLoopListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForeachLoopListSyntax,slang::parsing::Token&,slang::syntax::NameSyntax&,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>const&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,NameSyntax *args_1,Token *args_2,
          SeparatedSyntaxList<slang::syntax::NameSyntax> *args_3,Token *args_4,Token *args_5)

{
  Token openParen;
  Token openBracket;
  Token closeBracket;
  Token closeParen;
  ForeachLoopListSyntax *this_00;
  
  this_00 = (ForeachLoopListSyntax *)allocate(this,0x98,8);
  openParen.kind = args->kind;
  openParen._2_1_ = args->field_0x2;
  openParen.numFlags.raw = (args->numFlags).raw;
  openParen.rawLen = args->rawLen;
  openParen.info = args->info;
  openBracket.kind = args_2->kind;
  openBracket._2_1_ = args_2->field_0x2;
  openBracket.numFlags.raw = (args_2->numFlags).raw;
  openBracket.rawLen = args_2->rawLen;
  openBracket.info = args_2->info;
  closeParen.kind = args_5->kind;
  closeParen._2_1_ = args_5->field_0x2;
  closeParen.numFlags.raw = (args_5->numFlags).raw;
  closeParen.rawLen = args_5->rawLen;
  closeParen.info = args_5->info;
  closeBracket.kind = args_4->kind;
  closeBracket._2_1_ = args_4->field_0x2;
  closeBracket.numFlags.raw = (args_4->numFlags).raw;
  closeBracket.rawLen = args_4->rawLen;
  closeBracket.info = args_4->info;
  syntax::ForeachLoopListSyntax::ForeachLoopListSyntax
            (this_00,openParen,args_1,openBracket,args_3,closeBracket,closeParen);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }